

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O0

Gia_Man_t * Acb_NtkGiaDeriveDual(Acb_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar2;
  int *piVar3;
  Vec_Int_t *vTemp;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar4;
  int *pLits;
  int iObj;
  int i;
  Vec_Int_t *vCopies;
  Vec_Int_t *vNodes;
  Vec_Int_t *vFanins;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkObjNum(p);
  p_00 = Vec_IntStartFull(iVar1 << 1);
  iVar1 = Acb_NtkObjNum(p);
  p_01 = Gia_ManStart(iVar1 * 5);
  pcVar2 = Acb_NtkName(p);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  p_01->pName = pcVar2;
  Gia_ManHashAlloc(p_01);
  piVar3 = Vec_IntEntryP(p_00,0);
  *piVar3 = 0;
  piVar3[1] = 0;
  for (pLits._4_4_ = 0; iVar1 = Acb_NtkCiNum(p), pLits._4_4_ < iVar1; pLits._4_4_ = pLits._4_4_ + 1)
  {
    iVar1 = Acb_NtkCi(p,pLits._4_4_);
    piVar3 = Vec_IntEntryP(p_00,iVar1 << 1);
    iVar1 = Gia_ManAppendCi(p_01);
    *piVar3 = iVar1;
    piVar3[1] = 0;
  }
  vTemp = Vec_IntAlloc(4);
  p_02 = Acb_NtkFindNodes2(p);
  for (pLits._4_4_ = 0; iVar1 = Vec_IntSize(p_02), pLits._4_4_ < iVar1;
      pLits._4_4_ = pLits._4_4_ + 1) {
    iVar1 = Vec_IntEntry(p_02,pLits._4_4_);
    piVar3 = Vec_IntEntryP(p_00,iVar1 << 1);
    Acb_ObjToGiaDual(p_01,p,iVar1,vTemp,p_00,piVar3);
  }
  Vec_IntFree(p_02);
  Vec_IntFree(vTemp);
  for (pLits._4_4_ = 0; iVar1 = Acb_NtkCoNum(p), pLits._4_4_ < iVar1; pLits._4_4_ = pLits._4_4_ + 1)
  {
    iVar1 = Acb_NtkCo(p,pLits._4_4_);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    piVar3 = Vec_IntEntryP(p_00,iVar1 << 1);
    Gia_ManAppendCo(p_01,*piVar3);
    Gia_ManAppendCo(p_01,piVar3[1]);
  }
  Vec_IntFree(p_00);
  pGVar4 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar4;
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveDual( Acb_Ntk_t * p )
{
    extern Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p );
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    Vec_Int_t * vCopies = Vec_IntStartFull( 2*Acb_NtkObjNum(p) );
    int i, iObj, * pLits;
    pNew = Gia_ManStart( 5 * Acb_NtkObjNum(p) );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    pLits = Vec_IntEntryP( vCopies, 0 );
    pLits[0] = 0;
    pLits[1] = 0;
    Acb_NtkForEachCi( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        pLits[0] = Gia_ManAppendCi(pNew);
        pLits[1] = 0;
    }
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        Acb_ObjToGiaDual( pNew, p, iObj, vFanins, vCopies, pLits );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*Acb_ObjFanin(p, iObj, 0) );
        Gia_ManAppendCo( pNew, pLits[0] );
        Gia_ManAppendCo( pNew, pLits[1] );
    }
    Vec_IntFree( vCopies );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}